

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDiurnal_kry_bp.c
# Opt level: O3

int main(void)

{
  double dVar1;
  uint uVar2;
  N_Vector u;
  void *pvVar3;
  void *cvode_mem;
  long lVar4;
  sunindextype ml;
  char *pcVar5;
  void *mu;
  int iVar6;
  int iVar7;
  SUNContext sunctx;
  sunrealtype t;
  undefined8 local_60;
  long local_58;
  void *local_50;
  void *local_48;
  double local_40;
  sunrealtype local_38;
  
  uVar2 = SUNContext_Create(0,&local_60);
  if ((int)uVar2 < 0) {
    pcVar5 = "SUNContext_Create";
  }
  else {
    u = (N_Vector)N_VNew_Serial(200,local_60);
    if (u == (N_Vector)0x0) {
      main_cold_4();
      return 1;
    }
    pvVar3 = malloc(0x38);
    if (pvVar3 == (void *)0x0) {
      main_cold_3();
      return 1;
    }
    *(undefined8 *)((long)pvVar3 + 8) = 0x3f13104b57cf96af;
    *(undefined8 *)((long)pvVar3 + 0x10) = 0x4001c71c71c71c72;
    *(undefined8 *)((long)pvVar3 + 0x18) = 0x4001c71c71c71c72;
    *(undefined8 *)((long)pvVar3 + 0x20) = 0x3eab2dd8d6457178;
    *(undefined8 *)((long)pvVar3 + 0x28) = 0x3f2d7dbf487fcb92;
    *(undefined8 *)((long)pvVar3 + 0x30) = 0x3e216505a7da8610;
    SetInitialProfiles(u,2.2222222222222223,2.2222222222222223);
    cvode_mem = (void *)CVodeCreate(2,local_60);
    local_48 = cvode_mem;
    if (cvode_mem == (void *)0x0) {
      main_cold_2();
      return 1;
    }
    uVar2 = CVodeSetUserData(cvode_mem,pvVar3);
    if ((int)uVar2 < 0) {
      pcVar5 = "CVodeSetUserData";
    }
    else {
      uVar2 = CVodeInit(0,cvode_mem,f,u);
      if ((int)uVar2 < 0) {
        pcVar5 = "CVodeInit";
      }
      else {
        uVar2 = CVodeSStolerances(0x88e368f1,0x3f50624dd2f1a9fc,cvode_mem);
        if ((int)uVar2 < 0) {
          pcVar5 = "CVodeSStolerances";
        }
        else {
          lVar4 = SUNLinSol_SPGMR(u,1,0,local_60);
          if (lVar4 == 0) {
            main_cold_1();
            return 1;
          }
          uVar2 = CVodeSetLinearSolver(cvode_mem,lVar4,0);
          if (-1 < (int)uVar2) {
            ml = 200;
            mu = cvode_mem;
            local_58 = lVar4;
            local_50 = pvVar3;
            CVBandPrecInit(cvode_mem,200,2,2);
            PrintIntro((sunindextype)mu,ml);
            iVar6 = 1;
            do {
              if (iVar6 == 2) {
                SetInitialProfiles(u,*(sunrealtype *)((long)local_50 + 0x10),
                                   *(sunrealtype *)((long)local_50 + 0x18));
                uVar2 = CVodeReInit(0,cvode_mem,u);
                if ((int)uVar2 < 0) {
                  pcVar5 = "CVodeReInit";
                  goto LAB_0010280d;
                }
                uVar2 = SUNLinSol_SPGMRSetPrecType(local_58,2);
                if ((int)uVar2 < 0) {
                  pcVar5 = "SUNLinSol_SPGMRSetPrecType";
                  goto LAB_0010280d;
                }
                CVBandPrecInit(cvode_mem,200,2,2);
                printf("\n\n-------------------------------------------------------");
                puts("------------");
              }
              pcVar5 = "SUN_PREC_RIGHT";
              if (iVar6 == 1) {
                pcVar5 = "SUN_PREC_LEFT";
              }
              printf("\n\nPreconditioner type is:  jpre = %s\n\n",pcVar5);
              iVar7 = 0xc;
              dVar1 = 7200.0;
              do {
                local_40 = dVar1;
                uVar2 = CVode(cvode_mem,u,&local_38,1);
                if ((int)uVar2 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVode",
                          (ulong)uVar2);
                }
                cvode_mem = local_48;
                PrintOutput(local_48,u,local_38);
                if (uVar2 != 0) break;
                dVar1 = local_40 + 7200.0;
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
              PrintFinalStats(cvode_mem);
              iVar6 = iVar6 + 1;
              if (iVar6 == 3) {
                N_VDestroy(u);
                free(local_50);
                CVodeFree(&local_48);
                SUNLinSolFree(local_58);
                SUNContext_Free(&local_60);
                return 0;
              }
            } while( true );
          }
          pcVar5 = "CVodeSetLinearSolver";
        }
      }
    }
  }
LAB_0010280d:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar5,(ulong)uVar2);
  return 1;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype abstol, reltol, t, tout;
  N_Vector u;
  UserData data;
  SUNLinearSolver LS;
  void* cvode_mem;
  int retval, iout, jpre;
  sunindextype ml, mu;

  u         = NULL;
  data      = NULL;
  LS        = NULL;
  cvode_mem = NULL;

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate and initialize u, and set problem data and tolerances */
  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }
  InitUserData(data);
  SetInitialProfiles(u, data->dx, data->dy);
  abstol = ATOL;
  reltol = RTOL;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Set the pointer to user-defined data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in u'=f(t,u), the initial time T0, and
   * the initial dependent variable vector u. */
  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative tolerance
   * and scalar absolute tolerances */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Call SUNLinSol_SPGMR to specify the linear solver SPGMR
   * with left preconditioning and the default Krylov dimension */
  LS = SUNLinSol_SPGMR(u, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Call CVodeSetLinearSolver to attach the linear solver to CVode */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* Call CVBandPreInit to initialize band preconditioner */
  ml = mu = 2;
  retval  = CVBandPrecInit(cvode_mem, NEQ, mu, ml);
  if (check_retval(&retval, "CVBandPrecInit", 0)) { return (1); }

  PrintIntro(mu, ml);

  /* Loop over jpre (= SUN_PREC_LEFT, SUN_PREC_RIGHT), and solve the problem */

  for (jpre = SUN_PREC_LEFT; jpre <= SUN_PREC_RIGHT; jpre++)
  {
    /* On second run, re-initialize u, the solver, and SPGMR */

    if (jpre == SUN_PREC_RIGHT)
    {
      SetInitialProfiles(u, data->dx, data->dy);

      retval = CVodeReInit(cvode_mem, T0, u);
      if (check_retval(&retval, "CVodeReInit", 1)) { return (1); }

      retval = SUNLinSol_SPGMRSetPrecType(LS, SUN_PREC_RIGHT);
      if (check_retval(&retval, "SUNLinSol_SPGMRSetPrecType", 1))
      {
        return (1);
      }

      retval = CVBandPrecInit(cvode_mem, NEQ, mu, ml);
      if (check_retval(&retval, "CVBandPrecInit", 0)) { return (1); }

      printf("\n\n-------------------------------------------------------");
      printf("------------\n");
    }

    printf("\n\nPreconditioner type is:  jpre = %s\n\n",
           (jpre == SUN_PREC_LEFT) ? "SUN_PREC_LEFT" : "SUN_PREC_RIGHT");

    /* In loop over output points, call CVode, print results, test for error */

    for (iout = 1, tout = TWOHR; iout <= NOUT; iout++, tout += TWOHR)
    {
      retval = CVode(cvode_mem, tout, u, &t, CV_NORMAL);
      check_retval(&retval, "CVode", 1);
      PrintOutput(cvode_mem, u, t);
      if (retval != CV_SUCCESS) { break; }
    }

    /* Print final statistics */

    PrintFinalStats(cvode_mem);

  } /* End of jpre loop */

  /* Free memory */
  N_VDestroy(u);
  free(data);
  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNContext_Free(&sunctx);

  return (0);
}